

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Acec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Abc_Frame_t *pAbc_00;
  int iVar4;
  uint uVar5;
  int iVar6;
  FILE *__stream;
  Gia_Man_t *pGVar7;
  char *pcVar8;
  char *pcVar9;
  Gia_Man_t *pGia0;
  Cec_ParCec_t ParsCec;
  Gia_Man_t *pGia1;
  Gia_Man_t *local_70;
  Cec_ParCec_t local_64;
  Abc_Frame_t *local_40;
  Gia_Man_t *local_38;
  
  local_40 = pAbc;
  Cec_ManCecSetDefaultParams(&local_64);
  bVar1 = false;
  Extra_UtilGetoptReset();
  bVar2 = false;
  bVar3 = false;
  do {
    while (iVar4 = Extra_UtilGetopt(argc,argv,"CTnmdtvh"), pAbc_00 = local_40,
          iVar6 = globalUtilOptind, 99 < iVar4) {
      switch(iVar4) {
      case 0x6d:
        bVar1 = (bool)(bVar1 ^ 1);
        break;
      case 0x6e:
        local_64.fNaive = local_64.fNaive ^ 1;
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x72:
      case 0x73:
      case 0x75:
        goto switchD_0023ac93_caseD_6f;
      case 0x74:
        bVar3 = (bool)(bVar3 ^ 1);
        break;
      case 0x76:
        local_64.fVerbose = local_64.fVerbose ^ 1;
        break;
      default:
        if (iVar4 != 100) goto switchD_0023ac93_caseD_6f;
        bVar2 = (bool)(bVar2 ^ 1);
      }
    }
    if (iVar4 == 0x43) {
      if (argc <= globalUtilOptind) {
        pcVar8 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0023ad8b:
        Abc_Print(-1,pcVar8);
        break;
      }
      uVar5 = atoi(argv[globalUtilOptind]);
      local_64.nBTLimit = uVar5;
    }
    else {
      if (iVar4 != 0x54) {
        if (iVar4 == -1) {
          if (bVar1) {
            pGVar7 = local_40->pGia;
            if (pGVar7 == (Gia_Man_t *)0x0) {
              pcVar8 = "Abc_CommandAbc9Acec(): There is no AIG.\n";
            }
            else {
              if (bVar2) {
                if ((pGVar7->vCos->nSize - pGVar7->nRegs & 1U) == 0) {
                  if (local_64.fSilent == 0) {
                    Abc_Print(1,
                              "Assuming the current network is a double-output miter. (Conflict limit = %d.)\n"
                              ,(ulong)(uint)local_64.nBTLimit);
                  }
                  Gia_ManDemiterDual(pAbc_00->pGia,&local_70,&local_38);
                  goto LAB_0023b0d6;
                }
              }
              else {
                if (!bVar3) {
                  if (local_64.fSilent == 0) {
                    Abc_Print(1,
                              "Assuming the current network is a single-output miter. (Conflict limit = %d.)\n"
                              ,(ulong)(uint)local_64.nBTLimit);
                  }
                  pGVar7 = Gia_ManDemiterToDual(pAbc_00->pGia);
                  Gia_ManDemiterDual(pGVar7,&local_70,&local_38);
                  Gia_ManStop(pGVar7);
LAB_0023b0d6:
                  iVar6 = Gia_PolynCec(local_70,local_38,&local_64);
                  pAbc_00->Status = iVar6;
                  Abc_FrameReplaceCex(pAbc_00,&local_70->pCexComb);
                  Gia_ManStop(local_70);
                  Gia_ManStop(local_38);
                  return 0;
                }
                if ((pGVar7->vCos->nSize - pGVar7->nRegs & 1U) == 0) {
                  if (local_64.fSilent == 0) {
                    Abc_Print(1,
                              "Assuming the current network is a two-word miter. (Conflict limit = %d.)\n"
                              ,(ulong)(uint)local_64.nBTLimit);
                  }
                  Gia_ManDemiterTwoWords(pAbc_00->pGia,&local_70,&local_38);
                  goto LAB_0023b0d6;
                }
              }
              pcVar8 = "The dual-output miter should have an even number of outputs.\n";
            }
          }
          else {
            if (argc - globalUtilOptind == 1) {
              pcVar8 = argv[globalUtilOptind];
              pcVar9 = pcVar8;
LAB_0023af05:
              do {
                if (*pcVar8 == '>') {
                  *pcVar8 = '\\';
                }
                else if (*pcVar8 == '\0') {
                  __stream = fopen(pcVar9,"r");
                  if (__stream == (FILE *)0x0) {
                    Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar9);
                    pcVar8 = Extra_FileGetSimilarName
                                       (pcVar9,".aig",(char *)0x0,(char *)0x0,(char *)0x0,
                                        (char *)0x0);
                    if (pcVar8 != (char *)0x0) {
                      Abc_Print(1,"Did you mean \"%s\"?",pcVar8);
                    }
                    pcVar8 = "\n";
                    iVar6 = 1;
                    iVar4 = 1;
                  }
                  else {
                    fclose(__stream);
                    pGVar7 = Gia_AigerRead(pcVar9,0,0,0);
                    if (pGVar7 != (Gia_Man_t *)0x0) {
                      iVar6 = Gia_PolynCec(pAbc_00->pGia,pGVar7,&local_64);
                      pAbc_00->Status = iVar6;
                      Abc_FrameReplaceCex(pAbc_00,&pAbc_00->pGia->pCexComb);
                      Gia_ManStop(pGVar7);
                      return 0;
                    }
                    pcVar8 = "Reading AIGER has failed.\n";
                    iVar6 = 0;
                    iVar4 = -1;
                  }
                  Abc_Print(iVar4,pcVar8);
                  return iVar6;
                }
                pcVar8 = pcVar8 + 1;
              } while( true );
            }
            pcVar8 = local_40->pGia->pSpec;
            pcVar9 = pcVar8;
            if (pcVar8 != (char *)0x0) goto LAB_0023af05;
            pcVar8 = "File name is not given on the command line.\n";
          }
          iVar6 = -1;
          goto LAB_0023aeab;
        }
        break;
      }
      if (argc <= globalUtilOptind) {
        pcVar8 = "Command line switch \"-T\" should be followed by an integer.\n";
        goto LAB_0023ad8b;
      }
      uVar5 = atoi(argv[globalUtilOptind]);
      local_64.TimeLimit = uVar5;
    }
    globalUtilOptind = iVar6 + 1;
  } while (-1 < (int)uVar5);
switchD_0023ac93_caseD_6f:
  Abc_Print(-2,"usage: &acec [-CT num] [-nmdtvh]\n");
  Abc_Print(-2,"\t         combinational equivalence checking for arithmetic circuits\n");
  Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
            (ulong)(uint)local_64.nBTLimit);
  Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",
            (ulong)(uint)local_64.TimeLimit);
  pcVar9 = "yes";
  pcVar8 = "yes";
  if (local_64.fNaive == 0) {
    pcVar8 = "no";
  }
  Abc_Print(-2,"\t-n     : toggle using naive SAT-based checking [default = %s]\n",pcVar8);
  pcVar8 = "miter";
  if (!bVar1) {
    pcVar8 = "two circuits";
  }
  Abc_Print(-2,"\t-m     : toggle miter vs. two circuits [default = %s]\n",pcVar8);
  pcVar8 = "yes";
  if (!bVar2) {
    pcVar8 = "no";
  }
  Abc_Print(-2,"\t-d     : toggle using dual output miter [default = %s]\n",pcVar8);
  pcVar8 = "yes";
  if (!bVar3) {
    pcVar8 = "no";
  }
  Abc_Print(-2,"\t-t     : toggle using two-word miter [default = %s]\n",pcVar8);
  if (local_64.fVerbose == 0) {
    pcVar9 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar9);
  pcVar8 = "\t-h     : print the command usage\n";
  iVar6 = -2;
LAB_0023aeab:
  Abc_Print(iVar6,pcVar8);
  return 1;
}

Assistant:

int Abc_CommandAbc9Acec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pFile;
    Cec_ParCec_t ParsCec, * pPars = &ParsCec;
    Gia_Man_t * pSecond;
    char * FileName, * pTemp;
    char ** pArgvNew;
    int c, nArgcNew, fMiter = 0, fDualOutput = 0, fTwoOutput = 0;
    Cec_ManCecSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CTnmdtvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeLimit < 0 )
                goto usage;
            break;
        case 'n':
            pPars->fNaive ^= 1;
            break;
        case 'm':
            fMiter ^= 1;
            break;
        case 'd':
            fDualOutput ^= 1;
            break;
        case 't':
            fTwoOutput ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( fMiter )
    {
        Gia_Man_t * pGia0, * pGia1, * pDual;
        if ( pAbc->pGia == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9Acec(): There is no AIG.\n" );
            return 1;
        }
        if ( fDualOutput )
        {
            if ( Gia_ManPoNum(pAbc->pGia) & 1 )
            {
                Abc_Print( -1, "The dual-output miter should have an even number of outputs.\n" );
                return 1;
            }
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a double-output miter. (Conflict limit = %d.)\n", pPars->nBTLimit );
            Gia_ManDemiterDual( pAbc->pGia, &pGia0, &pGia1 );
            pAbc->Status = Gia_PolynCec( pGia0, pGia1, pPars );
        }
        else if ( fTwoOutput )
        {
            if ( Gia_ManPoNum(pAbc->pGia) & 1 )
            {
                Abc_Print( -1, "The dual-output miter should have an even number of outputs.\n" );
                return 1;
            }
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a two-word miter. (Conflict limit = %d.)\n", pPars->nBTLimit );
            Gia_ManDemiterTwoWords( pAbc->pGia, &pGia0, &pGia1 );
            pAbc->Status = Gia_PolynCec( pGia0, pGia1, pPars );
        }
        else
        {
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a single-output miter. (Conflict limit = %d.)\n", pPars->nBTLimit );
            pDual = Gia_ManDemiterToDual( pAbc->pGia );
            Gia_ManDemiterDual( pDual, &pGia0, &pGia1 );
            Gia_ManStop( pDual );
            pAbc->Status = Gia_PolynCec( pGia0, pGia1, pPars );
        }        
        Abc_FrameReplaceCex( pAbc, &pGia0->pCexComb );
        Gia_ManStop( pGia0 );
        Gia_ManStop( pGia1 );
        return 0;
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        if ( pAbc->pGia->pSpec == NULL )
        {
            Abc_Print( -1, "File name is not given on the command line.\n" );
            return 1;
        }
        FileName = pAbc->pGia->pSpec;
    }
    else
        FileName = pArgvNew[0];
    // fix the wrong symbol
    for ( pTemp = FileName; *pTemp; pTemp++ )
        if ( *pTemp == '>' )
            *pTemp = '\\';
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
        if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", FileName );
        Abc_Print( 1, "\n" );
        return 1;
    }
    fclose( pFile );
    pSecond = Gia_AigerRead( FileName, 0, 0, 0 );
    if ( pSecond == NULL )
    {
        Abc_Print( -1, "Reading AIGER has failed.\n" );
        return 0;
    }
    pAbc->Status = Gia_PolynCec( pAbc->pGia, pSecond, pPars );
    Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexComb );
    Gia_ManStop( pSecond );
    return 0;

usage:
    Abc_Print( -2, "usage: &acec [-CT num] [-nmdtvh]\n" );
    Abc_Print( -2, "\t         combinational equivalence checking for arithmetic circuits\n" );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n", pPars->TimeLimit );
    Abc_Print( -2, "\t-n     : toggle using naive SAT-based checking [default = %s]\n", pPars->fNaive? "yes":"no");
    Abc_Print( -2, "\t-m     : toggle miter vs. two circuits [default = %s]\n", fMiter? "miter":"two circuits");
    Abc_Print( -2, "\t-d     : toggle using dual output miter [default = %s]\n", fDualOutput? "yes":"no");
    Abc_Print( -2, "\t-t     : toggle using two-word miter [default = %s]\n", fTwoOutput? "yes":"no");
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", pPars->fVerbose? "yes":"no");
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}